

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.cpp
# Opt level: O0

void __thiscall Material::removeFloatUniform(Material *this,string *uniformName)

{
  bool bVar1;
  _Self local_30;
  _Base_ptr local_28;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float_*>_>
  local_20;
  iterator it;
  string *uniformName_local;
  Material *this_local;
  
  it._M_node = (_Base_ptr)uniformName;
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float_*>_>
  ::_Rb_tree_iterator(&local_20);
  local_28 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float_*>_>_>
             ::find(&this->floatUniforms,uniformName);
  local_20._M_node = local_28;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float_*>_>_>
       ::end(&this->floatUniforms);
  bVar1 = std::operator!=(&local_20,&local_30);
  if (bVar1) {
    std::
    map<std::__cxx11::string,float*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,float*>>>
    ::erase_abi_cxx11_((map<std::__cxx11::string,float*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,float*>>>
                        *)&this->floatUniforms,(iterator)local_20._M_node);
  }
  return;
}

Assistant:

void Material::removeFloatUniform(std::string uniformName)
{
	std::map<std::string, float*>::iterator it;
	it = floatUniforms.find(uniformName);
	if (it != floatUniforms.end())
	{
		floatUniforms.erase(it);
	}
}